

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_verify(secp256k1_gej *a)

{
  secp256k1_fe_verify(&a->x);
  secp256k1_fe_verify(&a->y);
  secp256k1_fe_verify(&a->z);
  secp256k1_fe_verify_magnitude(&a->x,4);
  secp256k1_fe_verify_magnitude(&a->y,4);
  secp256k1_fe_verify_magnitude(&a->z,1);
  if ((uint)a->infinity < 2) {
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/group_impl.h"
          ,0x5e,"test condition failed: a->infinity == 0 || a->infinity == 1");
  abort();
}

Assistant:

static void secp256k1_gej_verify(const secp256k1_gej *a) {
    SECP256K1_FE_VERIFY(&a->x);
    SECP256K1_FE_VERIFY(&a->y);
    SECP256K1_FE_VERIFY(&a->z);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->x, SECP256K1_GEJ_X_MAGNITUDE_MAX);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->y, SECP256K1_GEJ_Y_MAGNITUDE_MAX);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->z, SECP256K1_GEJ_Z_MAGNITUDE_MAX);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);
    (void)a;
}